

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

uint strhashl(char *s,int l)

{
  uint uVar1;
  long lVar2;
  
  if (0 < l) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = (int)s[lVar2] + uVar1 * 0x10;
      uVar1 = uVar1 & 0xfffffff ^ uVar1 >> 0x18 & 0xfffffff0;
      lVar2 = lVar2 + 1;
    } while (l != (int)lVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

uint strhashl(const char *s, int l) {
  uint h = 0, g;
  int i = 0;

  for (; i < l; i++, s++) {
    h = (h << 4) + *s;
    if ((g = h & 0xf0000000)) h = (h ^ (g >> 24)) ^ g;
  }
  return h;
}